

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O2

unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> __thiscall
pfederc::Parser::fromExprToTemplateDecl
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  long *in_RDX;
  Parser *this_00;
  _Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false> local_48;
  undefined2 local_3a;
  undefined1 local_38 [16];
  
  if ((Expr *)*in_RDX != (Expr *)0x0) {
    bVar3 = isTokenExpr((Expr *)*in_RDX,TOK_ID);
    if (bVar3) {
      lVar1 = *in_RDX;
      *in_RDX = 0;
      if (lVar1 == 0) {
        local_48._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)0x0;
      }
      else {
        local_48._M_head_impl =
             (Error<pfederc::SyntaxErrorCode> *)
             __dynamic_cast(lVar1,&Expr::typeinfo,&TokenExpr::typeinfo,0);
      }
      std::
      make_unique<pfederc::TemplateDecl,std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>>
                ((unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)this);
LAB_00117827:
      if (local_48._M_head_impl == (Error<pfederc::SyntaxErrorCode> *)0x0) {
        return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
                )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
                  )this;
      }
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
      return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
              )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
                )this;
    }
    bVar3 = isBiOpExpr((Expr *)*in_RDX,TOK_OP_DCL);
    if (bVar3) {
      plVar2 = (long *)*in_RDX;
      if ((undefined **)*plVar2 != &PTR__BiOpExpr_0012b998) {
        __cxa_bad_cast();
      }
      bVar3 = isTokenExpr((Expr *)plVar2[9],TOK_ID);
      if (bVar3) {
        lVar1 = plVar2[9];
        plVar2[9] = 0;
        if (lVar1 == 0) {
          local_48._M_head_impl = (Error<pfederc::SyntaxErrorCode> *)0x0;
        }
        else {
          local_48._M_head_impl =
               (Error<pfederc::SyntaxErrorCode> *)
               __dynamic_cast(lVar1,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        }
        local_38._0_8_ = plVar2[10];
        plVar2[10] = 0;
        std::
        make_unique<pfederc::TemplateDecl,std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)this,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_48);
        if ((long *)local_38._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_38._0_8_ + 8))();
        }
        goto LAB_00117827;
      }
      local_3a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
      local_38._0_4_ = 6;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_48,(SyntaxErrorCode *)&local_3a,(Position *)local_38);
      this_00 = (Parser *)(local_38 + 8);
    }
    else {
      local_3a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
      local_38._0_4_ = 9;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_48,(SyntaxErrorCode *)&local_3a,(Position *)local_38);
      this_00 = (Parser *)&stack0xffffffffffffffd8;
    }
    generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)rhs);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&local_48);
  }
  this->lexer = (Lexer *)0x0;
  return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
          )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TemplateDecl> Parser::fromExprToTemplateDecl(std::unique_ptr<Expr> &&rhs) noexcept {
  if (!rhs) {
    return nullptr;
  }

  if (isTokenExpr(*rhs, TokenType::TOK_ID)) {
    return std::make_unique<TemplateDecl>(std::unique_ptr<TokenExpr>(
          dynamic_cast<TokenExpr*>(rhs.release())));
  }

  if (!isBiOpExpr(*rhs, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, rhs->getPosition()));
    return nullptr;
  }

  BiOpExpr& bioprhs = dynamic_cast<BiOpExpr&>(*rhs);

  if (!isTokenExpr(bioprhs.getLeft(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR, SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, bioprhs.getPosition()));
    return nullptr;
  }
  
  return std::make_unique<TemplateDecl>(
    std::unique_ptr<TokenExpr>(dynamic_cast<TokenExpr*>(bioprhs.getLeftPtr().release())),
    bioprhs.getRightPtr());
}